

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGeneratorFactory.cxx
# Opt level: O3

cmCPackGenerator * __thiscall
cmCPackGeneratorFactory::NewGeneratorInternal(cmCPackGeneratorFactory *this,string *name)

{
  iterator iVar1;
  cmCPackGenerator *pcVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)()>_>_>
          ::find(&(this->GeneratorCreators)._M_t,name);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->GeneratorCreators)._M_t._M_impl.super__Rb_tree_header) {
    pcVar2 = (cmCPackGenerator *)(**(code **)(iVar1._M_node + 2))();
    return pcVar2;
  }
  return (cmCPackGenerator *)0x0;
}

Assistant:

cmCPackGenerator* cmCPackGeneratorFactory::NewGeneratorInternal(
  const std::string& name)
{
  cmCPackGeneratorFactory::t_GeneratorCreatorsMap::iterator it
    = this->GeneratorCreators.find(name);
  if ( it == this->GeneratorCreators.end() )
    {
    return 0;
    }
  return (it->second)();
}